

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

mat4 * projection(mat4 *__return_storage_ptr__,double coeff)

{
  vec<4UL,_double> *this;
  double *pdVar1;
  mat4 *Projection;
  double coeff_local;
  
  mat<4UL,_4UL>::identity();
  this = mat<4UL,_4UL>::operator[](__return_storage_ptr__,3);
  pdVar1 = vec<4UL,_double>::operator[](this,2);
  *pdVar1 = coeff;
  return __return_storage_ptr__;
}

Assistant:

mat4 projection(double coeff)
{
    mat4 Projection = mat4::identity();
    Projection[3][2] = coeff;
    return Projection;
}